

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverSyntaxTest_SyntaxEditions_Test::
~DescriptorPoolTypeResolverSyntaxTest_SyntaxEditions_Test
          (DescriptorPoolTypeResolverSyntaxTest_SyntaxEditions_Test *this)

{
  DescriptorPoolTypeResolverSyntaxTest_SyntaxEditions_Test *this_local;
  
  ~DescriptorPoolTypeResolverSyntaxTest_SyntaxEditions_Test(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, SyntaxEditions) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "editions"
    edition: EDITION_2023
    message_type { name: "MyMessage" }
  )pb");

  Type type;
  ASSERT_TRUE(
      resolver_->ResolveMessageType(GetTypeUrl("test.MyMessage"), &type).ok());
  EXPECT_EQ(type.syntax(), Syntax::SYNTAX_EDITIONS);
  EXPECT_EQ(type.edition(), "2023");
}